

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

void __thiscall cmCTestGIT::DiffParser::DiffParser(DiffParser *this,cmCTestGIT *git,char *prefix)

{
  char *prefix_local;
  cmCTestGIT *git_local;
  DiffParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\0',false);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__DiffParser_0166ff50;
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::vector
            (&this->Changes);
  this->GIT = git;
  this->DiffField = DiffFieldNone;
  cmCTestGlobalVC::Change::Change(&this->CurChange,'?');
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(git->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  return;
}

Assistant:

DiffParser(cmCTestGIT* git, const char* prefix)
    : LineParser('\0', false)
    , GIT(git)
  {
    this->SetLog(&git->Log, prefix);
  }